

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

const_reference __thiscall
pstore::sparse_array<unsigned_long,_unsigned_int>::back
          (sparse_array<unsigned_long,_unsigned_int> *this)

{
  uint uVar1;
  unsigned_long *puVar2;
  indices local_c;
  
  local_c.bitmap_ = this->bitmap_;
  if (local_c.bitmap_ != 0) {
    uVar1 = indices::back(&local_c);
    puVar2 = sparse_array<unsigned_long,unsigned_int>::
             index_impl<pstore::sparse_array<unsigned_long,unsigned_int>const&,unsigned_long_const>
                       (this,(ulong)uVar1);
    return puVar2;
  }
  assert_failed("!empty ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                ,0x183);
}

Assistant:

constexpr bool empty () const noexcept { return bitmap_ == 0U; }